

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::
async_request<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
          (coro_http_client *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uri,http_method method,
          req_context<std::basic_string_view<char,_std::char_traits<char>_>_> *ctx,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *headers,span<char,_18446744073709551615UL> *out_buf)

{
  long lVar1;
  undefined8 uVar2;
  anon_class_8_1_8991fb9c_for__M_tp __d;
  duration duration;
  bool bVar3;
  undefined8 *puVar4;
  reference pvVar5;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  element_type *peVar6;
  undefined8 *extraout_RAX_03;
  undefined4 in_ECX;
  socklen_t __len;
  error_code *this_00;
  byte *pbVar7;
  coro_http_client *data;
  undefined8 in_RSI;
  LazyBase<cinatra::resp_data,_false> in_RDI;
  mutable_buffer mVar8;
  error_code eVar9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  req_context<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_000000a0;
  bool *in_stack_000000a8;
  size_t *in_stack_000000b0;
  error_code *in_stack_000000b8;
  coro_http_client *in_stack_000000c0;
  http_method in_stack_00000130;
  bool ok;
  bool no_schema;
  req_context<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_fffffffffffff758;
  req_context<std::basic_string_view<char,_std::char_traits<char>_>_> *b;
  undefined4 in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff764;
  undefined4 in_stack_fffffffffffff768;
  undefined4 in_stack_fffffffffffff76c;
  undefined4 in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff774;
  coro_http_client *in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff784;
  int local_874;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  undefined4 in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff79c;
  undefined4 in_stack_fffffffffffff7a0;
  undefined4 in_stack_fffffffffffff7a4;
  string *in_stack_fffffffffffff7b8;
  coro_http_client *in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7cc;
  undefined4 in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  int local_810;
  int local_794;
  int local_788;
  coro_http_client *in_stack_fffffffffffff880;
  coro_http_client *uri_00;
  coro_http_client *in_stack_fffffffffffff890;
  int local_754;
  undefined4 uStack_57c;
  undefined8 in_stack_fffffffffffffa88;
  undefined1 already_has_len;
  req_context<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_fffffffffffffa90;
  http_method in_stack_fffffffffffffa9c;
  uri_t *in_stack_fffffffffffffaa0;
  coro_http_client *in_stack_fffffffffffffaa8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffac0;
  allocator<char> local_451 [33];
  undefined8 local_430;
  const_buffer local_418;
  mutable_buffer local_408;
  __sv_type local_328;
  byte local_282;
  byte local_281;
  long local_180;
  undefined4 local_44;
  undefined8 *local_8;
  
  already_has_len = (undefined1)((ulong)in_stack_fffffffffffffa88 >> 0x38);
  local_8 = &stack0x00000008;
  local_44 = in_ECX;
  puVar4 = (undefined8 *)operator_new(0x418,(nothrow_t *)&std::nothrow);
  if (puVar4 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
    get_return_object_on_allocation_failure();
    return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
  }
  *puVar4 = async_request<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>;
  puVar4[1] = 
  async_request<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>;
  uri_00 = (coro_http_client *)(puVar4 + 0x4f);
  this_00 = (error_code *)(puVar4 + 0x6c);
  b = (req_context<std::basic_string_view<char,_std::char_traits<char>_>_> *)(puVar4 + 0x41);
  pbVar7 = (byte *)((long)puVar4 + 0x413);
  puVar4[0x80] = in_RSI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff778);
  *(undefined4 *)(puVar4 + 0x81) = local_44;
  req_context<std::basic_string_view<char,_std::char_traits<char>_>_>::req_context
            ((req_context<std::basic_string_view<char,_std::char_traits<char>_>_> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),in_stack_fffffffffffff758
            );
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                  (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff758);
  puVar4[0x68] = in_stack_00000008;
  puVar4[0x69] = in_stack_00000010;
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::LazyPromise
            ((LazyPromise<cinatra::resp_data> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::get_return_object
            ((LazyPromise<cinatra::resp_data> *)in_stack_fffffffffffff778);
  async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar4 + 2));
  bVar3 = std::suspend_always::await_ready((suspend_always *)((long)puVar4 + 0x411));
  if (!bVar3) {
    *(undefined1 *)(puVar4 + 0x82) = 0;
    async_request((void *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                  (void *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
  }
  std::suspend_always::await_resume((suspend_always *)((long)puVar4 + 0x411));
  bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x69350b);
  if (!bVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x69352a);
  }
  bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x693545);
  if (!bVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x693564);
  }
  local_180 = puVar4[0x80];
  uVar2 = puVar4[0x69];
  *(undefined8 *)(local_180 + 0x1008) = puVar4[0x68];
  *(undefined8 *)(local_180 + 0x1010) = uVar2;
  __d.this._4_4_ = in_stack_fffffffffffff774;
  __d.this._0_4_ = in_stack_fffffffffffff770;
  std::shared_ptr<int>::
  shared_ptr<cinatra::coro_http_client::async_request<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>(std::__cxx11::string,cinatra::http_method,cinatra::req_context<std::basic_string_view<char,std::char_traits<char>>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::span<char,18446744073709551615ul>)::_lambda(auto:1)_1_>
            ((shared_ptr<int> *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
             (nullptr_t)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),__d);
  std::error_code::error_code
            ((error_code *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  *(undefined4 *)(puVar4 + 0x35) = 0;
  *(undefined1 *)((long)puVar4 + 0x1ac) = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(puVar4 + 0x36));
  std::span<cinatra::http_header,_18446744073709551615UL>::span
            ((span<cinatra::http_header,_18446744073709551615UL> *)0x6935e2);
  std::error_code::error_code
            ((error_code *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  puVar4[0x77] = 0;
  *(undefined1 *)((long)puVar4 + 0x412) = 1;
  uri_t::uri_t((uri_t *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  std::
  __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x69364e);
  bVar3 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
  if ((bVar3) ||
     ((bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x69366b),
      !bVar3 && (pvVar5 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760
                                                ),(size_type)in_stack_fffffffffffff758),
                *pvVar5 != '/')))) {
    bVar3 = has_schema<std::__cxx11::string>
                      ((coro_http_client *)
                       CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff778);
    local_281 = (bVar3 ^ 0xffU) & 1;
    if (local_281 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                 (char *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    }
    local_282 = 0;
    data = uri_00;
    if ((local_281 & 1) != 0) {
      uri_00 = in_stack_fffffffffffff880;
      data = (coro_http_client *)(puVar4 + 0x53);
      in_stack_fffffffffffff890 = (coro_http_client *)(puVar4 + 0x53);
    }
    handle_uri<std::__cxx11::string>
              (in_stack_fffffffffffff890,(resp_data *)data,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uri_00);
    std::tie<bool,cinatra::uri_t>
              ((bool *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (uri_t *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    std::tuple<bool&,cinatra::uri_t&>::operator=
              ((tuple<bool_&,_cinatra::uri_t_&> *)
               CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
               (pair<bool,_cinatra::uri_t> *)
               CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    if ((local_282 & 1) == 0) {
      local_788 = 4;
    }
    else {
      local_788 = 0;
    }
    if (local_788 != 0) {
      local_794 = local_788;
      goto LAB_00694515;
    }
  }
  else {
    local_328 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    puVar4[0x15] = local_328._M_len;
    puVar4[0x16] = local_328._M_str;
    data = (coro_http_client *)local_328._M_str;
  }
  __len = (socklen_t)data;
  std::
  __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x6938d6);
  bVar3 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
  if (bVar3) {
    connect((coro_http_client *)(puVar4 + 0x79),(int)puVar4[0x80],(sockaddr *)(puVar4 + 0xd),__len);
    async_simple::coro::detail::LazyPromiseBase::
    await_transform<async_simple::coro::Lazy<cinatra::resp_data>>
              ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (Lazy<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    bVar3 = async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::await_ready
                      ((LazyAwaiterBase<cinatra::resp_data> *)(puVar4 + 0x78));
    if (!bVar3) {
      *(undefined1 *)(puVar4 + 0x82) = 1;
      async_request((void *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                    in_stack_fffffffffffff778);
      (*(code *)*extraout_RAX)(extraout_RAX);
      return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
    }
    puVar4[0x74] = (LazyAwaiterBase<cinatra::resp_data> *)(puVar4 + 0x78);
    async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
              ((LazyAwaiterBase<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
    memcpy(puVar4 + 0x33,puVar4 + 0x3a,0x38);
    async_simple::coro::detail::LazyBase<cinatra::resp_data,_false>::ValueAwaiter::~ValueAwaiter
              ((ValueAwaiter *)0x693a9d);
    async_simple::coro::Lazy<cinatra::resp_data>::~Lazy((Lazy<cinatra::resp_data> *)0x693aaa);
    if (*(int *)(puVar4 + 0x35) != 0) {
      async_simple::coro::detail::LazyPromise<cinatra::resp_data>::return_value<cinatra::resp_data>
                ((LazyPromise<cinatra::resp_data> *)
                 CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (resp_data *)in_stack_fffffffffffff758);
      local_794 = 3;
      goto LAB_00694515;
    }
  }
  std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::vector
            ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)0x693b4a);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                  (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff758);
  build_request_header<cinatra::req_context<std::basic_string_view<char,std::char_traits<char>>>>
            (in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,
             in_stack_fffffffffffffa90,(bool)already_has_len,in_stack_fffffffffffffac0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x693bbc);
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)(puVar4 + 0x21));
  *pbVar7 = (bVar3 ^ 0xffU) & 1;
  in_stack_fffffffffffff758 = b;
  if ((*pbVar7 & 1) != 0) {
    local_408 = (mutable_buffer)
                asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    asio::const_buffer::const_buffer
              ((const_buffer *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (mutable_buffer *)b);
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
               CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),(value_type *)b);
    std::basic_string_view<char,_std::char_traits<char>_>::data
              ((basic_string_view<char,_std::char_traits<char>_> *)(puVar4 + 0x21));
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)(puVar4 + 0x21));
    local_418 = (const_buffer)
                asio::buffer((void *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                             (size_t)b);
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
               CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),(value_type *)b);
    in_stack_fffffffffffff758 = b;
  }
  lVar1 = puVar4[0x80];
  null_logger_t::operator<<
            ((null_logger_t *)&NULL_LOGGER,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar4 + 0x57));
  local_430 = *(undefined8 *)(lVar1 + 0xfd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
             (char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
  duration.__r._4_4_ = in_stack_fffffffffffff7d4;
  duration.__r._0_4_ = in_stack_fffffffffffff7d0;
  timer_guard::timer_guard
            ((timer_guard *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
             in_stack_fffffffffffff7c0,duration,in_stack_fffffffffffff7b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  std::allocator<char>::~allocator(local_451);
  if ((*pbVar7 & 1) == 0) {
    mVar8 = (mutable_buffer)
            asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    *(mutable_buffer *)(puVar4 + 0x70) = mVar8;
    async_write<asio::mutable_buffers_1>
              (in_stack_fffffffffffff778,
               (mutable_buffers_1 *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
    async_simple::coro::detail::LazyPromiseBase::
    await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
              ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    bVar3 = async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>
            ::await_ready((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                          (puVar4 + 0x7c));
    if (!bVar3) {
      *(undefined1 *)(puVar4 + 0x82) = 3;
      async_request((void *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                    in_stack_fffffffffffff778);
      (*(code *)*extraout_RAX_01)(extraout_RAX_01);
      return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
    }
    puVar4[0x73] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)(puVar4 + 0x7c);
    async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
    awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    std::tie<std::error_code,unsigned_long>
              ((error_code *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (unsigned_long *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    std::tuple<std::error_code&,unsigned_long&>::operator=
              ((tuple<std::error_code_&,_unsigned_long_&> *)
               CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
               (pair<std::error_code,_unsigned_long> *)
               CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    local_810 = 0;
    async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
    ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x694241);
    async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
              ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x69424e);
    if (local_810 == 0) goto LAB_0069427f;
  }
  else {
    async_write<std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>&>
              (in_stack_fffffffffffff778,
               (vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
               CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
    async_simple::coro::detail::LazyPromiseBase::
    await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
              ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    bVar3 = async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>
            ::await_ready((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                          (puVar4 + 0x7a));
    if (!bVar3) {
      *(undefined1 *)(puVar4 + 0x82) = 2;
      async_request((void *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                    in_stack_fffffffffffff778);
      (*(code *)*extraout_RAX_00)(extraout_RAX_00);
      return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
    }
    puVar4[0x72] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)(puVar4 + 0x7a);
    async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
    awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    std::tie<std::error_code,unsigned_long>
              ((error_code *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (unsigned_long *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    std::tuple<std::error_code&,unsigned_long&>::operator=
              ((tuple<std::error_code_&,_unsigned_long_&> *)
               CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
               (pair<std::error_code,_unsigned_long> *)
               CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
    ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x694004);
    async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
              ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x694011);
LAB_0069427f:
    bVar3 = std::error_code::operator_cast_to_bool(this_00);
    if (bVar3) {
      local_810 = 4;
    }
    else {
      req_context<std::basic_string_view<char,_std::char_traits<char>_>_>::req_context
                ((req_context<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 in_stack_fffffffffffff758);
      in_stack_fffffffffffff758 =
           (req_context<std::basic_string_view<char,_std::char_traits<char>_>_> *)
           CONCAT44((int)((ulong)in_stack_fffffffffffff758 >> 0x20),*(undefined4 *)(puVar4 + 0x81));
      handle_read<std::basic_string_view<char,std::char_traits<char>>>
                (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                 in_stack_000000a0,in_stack_00000130);
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<cinatra::resp_data>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                 (Lazy<cinatra::resp_data> *)
                 CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
      bVar3 = async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::await_ready
                        ((LazyAwaiterBase<cinatra::resp_data> *)(puVar4 + 0x7e));
      if (!bVar3) {
        *(undefined1 *)(puVar4 + 0x82) = 4;
        async_request((void *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                      in_stack_fffffffffffff778);
        (*(code *)*extraout_RAX_02)(extraout_RAX_02);
        return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
      }
      puVar4[0x75] = (LazyAwaiterBase<cinatra::resp_data> *)(puVar4 + 0x7e);
      async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
                ((LazyAwaiterBase<cinatra::resp_data> *)
                 CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
      memcpy(puVar4 + 0x33,puVar4 + 0x48,0x38);
      local_810 = 0;
      async_simple::coro::detail::LazyBase<cinatra::resp_data,_false>::ValueAwaiter::~ValueAwaiter
                ((ValueAwaiter *)0x694489);
      async_simple::coro::Lazy<cinatra::resp_data>::~Lazy((Lazy<cinatra::resp_data> *)0x694496);
      req_context<std::basic_string_view<char,_std::char_traits<char>_>_>::~req_context
                ((req_context<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x6944a3);
      if (local_810 == 0) {
        local_810 = 0;
      }
    }
  }
  timer_guard::~timer_guard
            ((timer_guard *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::~vector
            ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
             CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  local_794 = local_810;
LAB_00694515:
  local_874 = local_794;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  if ((local_874 == 0) || (local_874 == 4)) {
    bVar3 = std::error_code::operator_cast_to_bool(this_00);
    if ((bVar3) &&
       (peVar6 = std::
                 __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x69458a), (peVar6->is_timeout_ & 1U) != 0)) {
      eVar9 = std::make_error_code(0);
      *(ulong *)this_00 = CONCAT44(uStack_57c,eVar9._M_value);
      puVar4[0x6d] = eVar9._M_cat;
    }
    eVar9._M_cat._0_4_ = in_stack_fffffffffffff780;
    eVar9._0_8_ = in_stack_fffffffffffff778;
    eVar9._M_cat._4_4_ = in_stack_fffffffffffff784;
    handle_result((coro_http_client *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                  (resp_data *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),eVar9,
                  SUB41((uint)in_stack_fffffffffffff764 >> 0x18,0));
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::return_value<cinatra::resp_data>
              ((LazyPromise<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
               (resp_data *)in_stack_fffffffffffff758);
    local_874 = 3;
  }
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x6946cf);
  local_754 = local_874;
  if (local_874 == 3) {
    async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar4 + 2));
    bVar3 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                      ((FinalAwaiter *)((long)puVar4 + 0x414));
    if (!bVar3) {
      *puVar4 = 0;
      *(undefined1 *)(puVar4 + 0x82) = 5;
      async_request((void *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
                    (void *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
      (*(code *)*extraout_RAX_03)(extraout_RAX_03);
      return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
    }
    async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
              ((FinalAwaiter *)((long)puVar4 + 0x414));
    in_stack_fffffffffffff764 = 0;
    local_754 = 0;
  }
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::~LazyPromise
            ((LazyPromise<cinatra::resp_data> *)0x69484e);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x69485b);
  req_context<std::basic_string_view<char,_std::char_traits<char>_>_>::~req_context
            ((req_context<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x694868);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff764,local_754));
  if (puVar4 != (undefined8 *)0x0) {
    operator_delete(puVar4,0x418);
  }
  return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<resp_data> async_request(
      S uri, http_method method, req_context<String> ctx,
      std::unordered_map<std::string, std::string> headers = {},
      std::span<char> out_buf = {}) {
    if (!resp_chunk_str_.empty()) {
      resp_chunk_str_.clear();
    }
    if (!body_.empty()) {
      body_.clear();
    }

    out_buf_ = out_buf;

    std::shared_ptr<int> guard(nullptr, [this](auto) {
      if (!req_headers_.empty()) {
        req_headers_.clear();
      }
    });

    resp_data data{};

    std::error_code ec{};
    size_t size = 0;
    bool is_keep_alive = true;

    do {
      uri_t u;
      std::string append_uri;

      if (socket_->has_closed_ || (!uri.empty() && uri[0] != '/')) {
        bool no_schema = !has_schema(uri);

        if (no_schema) {
#ifdef CINATRA_ENABLE_SSL
          if (is_ssl_schema_) {
            append_uri.append("https://").append(uri);
          }
          else
#endif
          {
            append_uri.append("http://").append(uri);
          }
        }
        bool ok = false;
        std::tie(ok, u) = handle_uri(data, no_schema ? append_uri : uri);
        if (!ok) {
          break;
        }
      }
      else {
        u.path = uri;
      }
      if (socket_->has_closed_) {
        data = co_await connect(u);
        if (data.status != 0) {
          co_return data;
        }
      }

      std::vector<asio::const_buffer> vec;
      std::string req_head_str =
          build_request_header(u, method, ctx, false, std::move(headers));

      bool has_body = !ctx.content.empty();
      if (has_body) {
        vec.push_back(asio::buffer(req_head_str));
        vec.push_back(asio::buffer(ctx.content.data(), ctx.content.size()));
      }

#ifdef CORO_HTTP_PRINT_REQ_HEAD
      CINATRA_LOG_DEBUG << req_head_str;
#endif
      auto guard = timer_guard(this, req_timeout_duration_, "request timer");
      if (has_body) {
        std::tie(ec, size) = co_await async_write(vec);
      }
      else {
        std::tie(ec, size) = co_await async_write(asio::buffer(req_head_str));
      }
      if (ec) {
        break;
      }
      data =
          co_await handle_read(ec, size, is_keep_alive, std::move(ctx), method);
    } while (0);
    if (ec && socket_->is_timeout_) {
      ec = std::make_error_code(std::errc::timed_out);
    }
    handle_result(data, ec, is_keep_alive);
    co_return data;
  }